

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

bool __thiscall
EnvironmentNAVXYTHETALATTICE::InitializeEnv(EnvironmentNAVXYTHETALATTICE *this,char *sEnvFile)

{
  FILE *__stream;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  __stream = fopen(sEnvFile,"r");
  if (__stream != (FILE *)0x0) {
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x37])(this,__stream);
    fclose(__stream);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x3b])(this,0);
    return true;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"SBPL has encountered a fatal error!","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_001574d0;
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::InitializeEnv(const char* sEnvFile)
{
    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        SBPL_ERROR("ERROR: unable to open %s\n", sEnvFile);
        throw SBPL_Exception();
    }
    ReadConfiguration(fCfg);
    fclose(fCfg);

    InitGeneral( NULL);

    return true;
}